

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryOutStream.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_19ea3::TestStreamingMultipleTimesConcatenatesResult::RunImpl
          (TestStreamingMultipleTimesConcatenatesResult *this)

{
  TestResults *results;
  ostream *poVar1;
  TestResults **ppTVar2;
  char *actual;
  TestDetails **ppTVar3;
  TestDetails local_1d8;
  undefined1 local_1a8 [8];
  MemoryOutStream stream;
  TestStreamingMultipleTimesConcatenatesResult *this_local;
  
  stream._400_8_ = this;
  UnitTest::MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1a8);
  poVar1 = std::operator<<((ostream *)local_1a8,"Bork");
  poVar1 = std::operator<<(poVar1,"Foo");
  std::operator<<(poVar1,"Bar");
  ppTVar2 = UnitTest::CurrentTest::Results();
  results = *ppTVar2;
  actual = UnitTest::MemoryOutStream::GetText((MemoryOutStream *)local_1a8);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_1d8,*ppTVar3,0x1d);
  UnitTest::CheckEqual(results,"BorkFooBar",actual,&local_1d8);
  UnitTest::MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1a8);
  return;
}

Assistant:

TEST(StreamingMultipleTimesConcatenatesResult)
{
    MemoryOutStream stream;
    stream << "Bork" << "Foo" << "Bar";
    CHECK_EQUAL("BorkFooBar", stream.GetText());
}